

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_gej(secp256k1_ge *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint64_t uVar47;
  uint64_t uVar48;
  uint64_t uVar49;
  uint64_t uVar50;
  int iVar51;
  int iVar52;
  ulong uVar53;
  size_t in_RCX;
  uchar *tag;
  ulong uVar54;
  ulong uVar55;
  secp256k1_fe *out32;
  secp256k1_fe *psVar56;
  uchar *in_R8;
  ulong uVar57;
  ulong uVar58;
  size_t in_R9;
  uint64_t tmp3;
  uint64_t tmp2;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_sha256 sStack_140;
  secp256k1_ge *psStack_d8;
  secp256k1_fe local_90;
  secp256k1_fe local_60;
  
  secp256k1_gej_verify(a);
  r->infinity = a->infinity;
  r_00 = &a->z;
  out32 = r_00;
  secp256k1_fe_inv(r_00,r_00);
  psVar56 = r_00;
  secp256k1_fe_verify(r_00);
  if ((a->z).magnitude < 9) {
    uVar55 = r_00->n[0];
    uVar58 = (a->z).n[1];
    uVar1 = (a->z).n[2];
    uVar2 = (a->z).n[3];
    uVar3 = (a->z).n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar55 * 2;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar58 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar3;
    uVar53 = SUB168(auVar6 * auVar26,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar53 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar25 + auVar4 * auVar24 + auVar7 * ZEXT816(0x1000003d10);
    uVar54 = auVar4._0_8_;
    local_90.n[0] = uVar54 & 0xfffffffffffff;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar54 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar3 = uVar3 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar55;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar58 * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar1;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar53 >> 0x34 | SUB168(auVar6 * auVar26,8) << 0xc;
    auVar4 = auVar8 * auVar27 + auVar40 + auVar9 * auVar28 + auVar10 * auVar29 +
             auVar11 * ZEXT816(0x1000003d10);
    uVar53 = auVar4._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar53 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar55;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar55;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar58;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar3;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1 * 2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar2;
    auVar4 = auVar13 * auVar31 + auVar41 + auVar14 * auVar32;
    uVar54 = auVar4._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar54 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (uVar54 & 0xfffffffffffff) << 4 | (uVar53 & 0xfffffffffffff) >> 0x30;
    auVar4 = auVar12 * auVar30 + ZEXT816(0x1000003d1) * auVar33;
    uVar54 = auVar4._0_8_;
    local_60.n[0] = uVar54 & 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar54 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar55 * 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar58;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar3;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar2;
    auVar5 = auVar16 * auVar35 + auVar43 + auVar17 * auVar36;
    uVar54 = auVar5._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar54 & 0xfffffffffffff;
    auVar4 = auVar15 * auVar34 + auVar42 + auVar18 * ZEXT816(0x1000003d10);
    uVar57 = auVar4._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar54 >> 0x34 | auVar5._8_8_ << 0xc;
    local_60.n[1] = uVar57 & 0xfffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar57 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar55 * 2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar1;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar58;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar58;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar45 = auVar21 * auVar39 + auVar45;
    uVar55 = auVar45._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar55 & 0xfffffffffffff;
    auVar4 = auVar19 * auVar37 + auVar44 + auVar20 * auVar38 + auVar22 * ZEXT816(0x1000003d10);
    uVar58 = auVar4._0_8_;
    local_60.n[2] = uVar58 & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (uVar58 >> 0x34 | auVar4._8_8_ << 0xc) + local_90.n[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar55 >> 0x34 | auVar45._8_8_ << 0xc;
    auVar46 = auVar23 * ZEXT816(0x1000003d10) + auVar46;
    uVar55 = auVar46._0_8_;
    local_60.n[3] = uVar55 & 0xfffffffffffff;
    local_60.n[4] = (uVar55 >> 0x34 | auVar46._8_8_ << 0xc) + (uVar53 & 0xffffffffffff);
    local_60.magnitude = 1;
    local_60.normalized = 0;
    secp256k1_fe_verify(&local_60);
    secp256k1_fe_mul(&local_90,r_00,&local_60);
    secp256k1_fe_mul(&a->x,&a->x,&local_60);
    secp256k1_fe_mul(&a->y,&a->y,&local_90);
    (a->z).n[0] = 1;
    (a->z).n[1] = 0;
    (a->z).n[2] = 0;
    (a->z).n[3] = 0;
    (a->z).n[4] = 0;
    (a->z).magnitude = 1;
    (a->z).normalized = 1;
    secp256k1_fe_verify(r_00);
    uVar47 = (a->x).n[0];
    uVar48 = (a->x).n[1];
    uVar49 = (a->x).n[2];
    uVar50 = (a->x).n[3];
    iVar51 = (a->x).magnitude;
    iVar52 = (a->x).normalized;
    (r->x).n[4] = (a->x).n[4];
    (r->x).magnitude = iVar51;
    (r->x).normalized = iVar52;
    (r->x).n[2] = uVar49;
    (r->x).n[3] = uVar50;
    (r->x).n[0] = uVar47;
    (r->x).n[1] = uVar48;
    uVar47 = (a->y).n[1];
    uVar48 = (a->y).n[2];
    uVar49 = (a->y).n[3];
    uVar50 = (a->y).n[4];
    iVar51 = (a->y).magnitude;
    iVar52 = (a->y).normalized;
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar47;
    (r->y).n[2] = uVar48;
    (r->y).n[3] = uVar49;
    (r->y).n[4] = uVar50;
    (r->y).magnitude = iVar51;
    (r->y).normalized = iVar52;
    secp256k1_ge_verify(r);
    return;
  }
  secp256k1_ge_set_gej_cold_1();
  psStack_d8 = r;
  if (psVar56 == (secp256k1_fe *)0x0) {
    secp256k1_tagged_sha256_cold_4();
  }
  else if (out32 != (secp256k1_fe *)0x0) {
    if (tag == (uchar *)0x0) {
      secp256k1_tagged_sha256_cold_2();
      return;
    }
    if (in_R8 == (uchar *)0x0) {
      secp256k1_tagged_sha256_cold_1();
      return;
    }
    secp256k1_sha256_initialize_tagged(&sStack_140,tag,in_RCX);
    secp256k1_sha256_write(&sStack_140,in_R8,in_R9);
    secp256k1_sha256_finalize(&sStack_140,(uchar *)out32);
    return;
  }
  secp256k1_tagged_sha256_cold_3();
  return;
}

Assistant:

static void secp256k1_ge_set_gej(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    secp256k1_gej_verify(a);
    r->infinity = a->infinity;
    secp256k1_fe_inv(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    r->x = a->x;
    r->y = a->y;
    secp256k1_ge_verify(r);
}